

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int nodeReaderNext(NodeReader *p)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  size_t __n;
  long lVar6;
  int nSuffix;
  int nPrefix;
  int rc;
  int local_3c;
  int local_38;
  int local_34;
  
  iVar4 = (p->term).n;
  local_38 = 0;
  local_3c = 0;
  local_34 = 0;
  if (p->iChild != 0 && iVar4 != 0) {
    p->iChild = p->iChild + 1;
  }
  iVar3 = p->iOff;
  iVar2 = p->nNode;
  if (iVar3 < iVar2) {
    if (iVar4 != 0) {
      cVar1 = p->aNode[iVar3];
      if (cVar1 < '\0') {
        iVar4 = sqlite3Fts3GetVarint32(p->aNode + iVar3,&local_38);
      }
      else {
        iVar4 = 1;
        local_38 = (int)cVar1;
      }
      p->iOff = iVar3 + iVar4;
    }
    iVar4 = p->iOff;
    cVar1 = p->aNode[iVar4];
    if (cVar1 < '\0') {
      iVar3 = sqlite3Fts3GetVarint32(p->aNode + iVar4,&local_3c);
    }
    else {
      iVar3 = 1;
      local_3c = (int)cVar1;
    }
    iVar3 = iVar3 + iVar4;
    p->iOff = iVar3;
    lVar6 = (long)local_38;
    iVar5 = 0x10b;
    iVar4 = iVar5;
    if ((local_38 <= iVar3) && (__n = (size_t)local_3c, local_3c <= iVar2 - iVar3)) {
      iVar3 = local_38 + local_3c;
      blobGrowBuffer(&p->term,iVar3,&local_34);
      iVar4 = local_34;
      if (local_34 == 0) {
        memcpy((p->term).a + lVar6,p->aNode + p->iOff,__n);
        (p->term).n = iVar3;
        lVar6 = (long)p->iOff + __n;
        p->iOff = (int)lVar6;
        iVar4 = local_34;
        if (p->iChild == 0) {
          cVar1 = p->aNode[lVar6];
          if (cVar1 < '\0') {
            iVar4 = sqlite3Fts3GetVarint32(p->aNode + lVar6,&p->nDoclist);
          }
          else {
            p->nDoclist = (int)cVar1;
            iVar4 = 1;
          }
          lVar6 = (long)iVar4 + (long)p->iOff;
          iVar3 = (int)lVar6;
          p->iOff = iVar3;
          iVar4 = iVar5;
          if (p->nDoclist <= p->nNode - iVar3) {
            p->aDoclist = p->aNode + lVar6;
            p->iOff = p->nDoclist + iVar3;
            iVar4 = local_34;
          }
        }
      }
    }
  }
  else {
    p->aNode = (char *)0x0;
    iVar4 = local_34;
  }
  return iVar4;
}

Assistant:

static int nodeReaderNext(NodeReader *p){
  int bFirst = (p->term.n==0);    /* True for first term on the node */
  int nPrefix = 0;                /* Bytes to copy from previous term */
  int nSuffix = 0;                /* Bytes to append to the prefix */
  int rc = SQLITE_OK;             /* Return code */

  assert( p->aNode );
  if( p->iChild && bFirst==0 ) p->iChild++;
  if( p->iOff>=p->nNode ){
    /* EOF */
    p->aNode = 0;
  }else{
    if( bFirst==0 ){
      p->iOff += fts3GetVarint32(&p->aNode[p->iOff], &nPrefix);
    }
    p->iOff += fts3GetVarint32(&p->aNode[p->iOff], &nSuffix);

    if( nPrefix>p->iOff || nSuffix>p->nNode-p->iOff ){
      return FTS_CORRUPT_VTAB;
    }
    blobGrowBuffer(&p->term, nPrefix+nSuffix, &rc);
    if( rc==SQLITE_OK ){
      memcpy(&p->term.a[nPrefix], &p->aNode[p->iOff], nSuffix);
      p->term.n = nPrefix+nSuffix;
      p->iOff += nSuffix;
      if( p->iChild==0 ){
        p->iOff += fts3GetVarint32(&p->aNode[p->iOff], &p->nDoclist);
        if( (p->nNode-p->iOff)<p->nDoclist ){
          return FTS_CORRUPT_VTAB;
        }
        p->aDoclist = &p->aNode[p->iOff];
        p->iOff += p->nDoclist;
      }
    }
  }

  assert( p->iOff<=p->nNode );
  return rc;
}